

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O3

bool __thiscall
Glucose::ClausesBuffer::getClause
          (ClausesBuffer *this,int threadId,int *threadOrigin,vec<Glucose::Lit> *resultClause,
          bool firstFound)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Lit local_3c;
  long local_38;
  
  puVar1 = (this->lastOfThread).data;
  local_38 = (long)threadId;
  uVar11 = puVar1[local_38];
  uVar5 = uVar11 + 1;
  uVar8 = this->first;
  uVar6 = this->maxsize;
  if (uVar5 == uVar6) {
    uVar5 = 0;
  }
  if (uVar5 == uVar8) {
    return false;
  }
  uVar5 = this->last;
  if (uVar5 <= uVar11 || uVar8 <= uVar5) {
    if ((uVar11 <= uVar8) || (uVar5 <= uVar11 && uVar8 <= uVar5)) goto LAB_0011a5eb;
  }
  uVar11 = uVar5;
LAB_0011a5eb:
  if (!firstFound) {
    uVar5 = 0;
    if (uVar11 + 1 != uVar6) {
      uVar5 = uVar11 + 1;
    }
    if (uVar5 != uVar8) {
      puVar2 = (this->elems).data;
      do {
        uVar10 = uVar11 + 3;
        uVar9 = 0;
        if (uVar6 <= uVar10) {
          uVar9 = uVar6;
        }
        if (puVar2[(int)(uVar10 - uVar9)] != threadId) break;
        uVar10 = uVar10 + puVar2[(int)uVar5];
        uVar11 = 0;
        if (uVar6 <= uVar10) {
          uVar11 = uVar6;
        }
        uVar11 = uVar10 - uVar11;
        uVar5 = 0;
        if (uVar11 + 1 != uVar6) {
          uVar5 = uVar11 + 1;
        }
      } while (uVar5 != uVar8);
    }
  }
  uVar5 = uVar11 + 1;
  if (uVar5 == uVar6) {
    uVar5 = 0;
  }
  if (uVar5 == uVar8) {
    puVar1[local_38] = uVar11;
    bVar4 = false;
  }
  else {
    puVar1 = (this->elems).data;
    uVar8 = puVar1[(int)uVar5];
    if (uVar5 + 1 < uVar6) {
      uVar6 = 0;
    }
    iVar7 = (uVar5 - uVar6) + 1;
    uVar6 = puVar1[iVar7];
    puVar1[iVar7] = uVar6 - 1;
    uVar10 = 1;
    if (uVar5 + 1 != this->maxsize) {
      uVar10 = uVar5 + 2;
    }
    if (uVar10 == this->maxsize) {
      uVar10 = 0;
    }
    *threadOrigin = puVar1[(int)uVar10];
    if (resultClause->data != (Lit *)0x0) {
      resultClause->sz = 0;
    }
    if (0 < (int)uVar8) {
      do {
        uVar5 = uVar10 + 1;
        uVar10 = 0;
        if (uVar5 != this->maxsize) {
          uVar10 = uVar5;
        }
        local_3c.x = (this->elems).data[(int)uVar10];
        vec<Glucose::Lit>::push(resultClause,&local_3c);
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    lVar3 = local_38;
    if ((this->last == uVar11) && (uVar6 - 1 == 0)) {
      removeLastClause(this);
      uVar10 = this->last;
    }
    (this->lastOfThread).data[lVar3] = uVar10;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ClausesBuffer::getClause(int threadId, int & threadOrigin, vec<Lit> & resultClause,  bool firstFound) {
    assert(lastOfThread.size() > threadId);
    unsigned int thislast = lastOfThread[threadId];
    assert(!firstFound || thislast == last); // FIXME: Gilles has this assertion on his cluster

    // Early exiting
    if (nextIndex(thislast) == first) return false;

    if ( ( thislast < last && last < first) ||
	    ( first < thislast && thislast < last ) ||
	    ( last < first && first < thislast) ) {
	// Special case where last has moved and lastOfThread[threadId] is no more valid (is behind)
	thislast = last; 
    }
    assert(!firstFound);
    // Go to next clause for this thread id
    if (!firstFound) { 
	while (nextIndex(thislast) != first && elems[addIndex(thislast,3)] == ((unsigned int)threadId)) { // 3 = 2 + 1 
	    thislast = addIndex(thislast, elems[nextIndex(thislast)] + headerSize); // 
	    assert(thislast >= 0);
	    assert(thislast < maxsize);
	}
	assert(nextIndex(thislast)==first || elems[addIndex(thislast,3)] != (unsigned int)threadId);
    }

    if (nextIndex(thislast) == first) {
	lastOfThread[threadId] = thislast;
	return false;
    }  
    assert(elems[addIndex(thislast,3)] != ((unsigned int) threadId));
    unsigned int previouslast = thislast;
    bool removeAfter = false;
    int csize = noCheckPop(thislast);
    removeAfter = (--elems[addIndex(thislast,1)] == 0); // We are sure this is not one of our own clause
    thislast = nextIndex(thislast); // Skips the removeAfter fieldr
    threadOrigin = noCheckPop(thislast);
    assert(threadOrigin != threadId);
    resultClause.clear();
    for(int i=0;i<csize;i++) {
	resultClause.push(toLit(noCheckPop(thislast)));
    }
    if (last == previouslast && removeAfter) {
	removeLastClause();
	thislast = last;
    }
    lastOfThread[threadId] = thislast;
    return true;
}